

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# litl_split.c
# Opt level: O1

int main(int argc,char **argv)

{
  char *__s1;
  int iVar1;
  char **ppcVar2;
  char *argv_00;
  int iVar3;
  
  argv_00 = (char *)argv;
  if (1 < argc) {
    iVar3 = 1;
    do {
      __s1 = argv[iVar3];
      argv_00 = "-f";
      iVar1 = strcmp(__s1,"-f");
      ppcVar2 = &__archive_name;
      if (iVar1 == 0) {
LAB_00101268:
        iVar1 = iVar3 + 1;
        *ppcVar2 = argv[(long)iVar3 + 1];
      }
      else {
        argv_00 = "-d";
        iVar1 = strcmp(__s1,"-d");
        ppcVar2 = &__output_dir;
        if (iVar1 == 0) goto LAB_00101268;
        argv_00 = "-h";
        iVar1 = strcmp(__s1,"-h");
        if (iVar1 == 0) {
          argv_00 = "-?";
          iVar1 = strcmp(__s1,"-?");
          if (iVar1 == 0) goto LAB_001012b5;
        }
        iVar1 = iVar3;
        if (*__s1 == '-') {
          argv_00 = (char *)argv;
          main_cold_1();
          goto LAB_001012b5;
        }
      }
      iVar3 = iVar1 + 1;
    } while (iVar3 < argc);
  }
  if ((*__archive_name != '\0') && (argv_00 = __output_dir, *__output_dir != '\0')) {
    litl_split_archive();
    return 0;
  }
LAB_001012b5:
  __usage((int)argv,(char **)argv_00);
  exit(-1);
}

Assistant:

int main(int argc, char **argv) {

  // parse the arguments passed to this program
  __parse_args(argc, argv);

  // split the archive
  litl_split_archive(__archive_name, __output_dir);

  return EXIT_SUCCESS;
}